

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

void __thiscall
wasm::WATParser::ParseTypeDefsCtx::addStructType(ParseTypeDefsCtx *this,StructT *type)

{
  bool bVar1;
  type *struct_;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  mapped_type *this_00;
  undefined1 local_58 [8];
  value_type name;
  undefined1 auStack_40 [4];
  Index i;
  type *local_30;
  type *str;
  type *fieldNames;
  StructT *local_18;
  StructT *type_local;
  ParseTypeDefsCtx *this_local;
  
  fieldNames = &type->first;
  local_18 = type;
  type_local = (StructT *)this;
  str = (type *)std::get<0ul,std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>(type);
  struct_ = std::get<1ul,std::vector<wasm::Name,std::allocator<wasm::Name>>,wasm::Struct>
                      ((pair<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Struct> *)
                       fieldNames);
  local_30 = struct_;
  _auStack_40 = TypeBuilder::operator[](this->builder,(ulong)this->index);
  TypeBuilder::Entry::operator=((Entry *)auStack_40,struct_);
  for (name.super_IString.str._M_str._4_4_ = 0; uVar2 = (ulong)name.super_IString.str._M_str._4_4_,
      sVar3 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                        ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)str), uVar2 < sVar3;
      name.super_IString.str._M_str._4_4_ = name.super_IString.str._M_str._4_4_ + 1) {
    pvVar4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                       ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)str,
                        (ulong)name.super_IString.str._M_str._4_4_);
    local_58 = (undefined1  [8])(pvVar4->super_IString).str._M_len;
    name.super_IString.str._M_len = (size_t)(pvVar4->super_IString).str._M_str;
    bVar1 = IString::is((IString *)local_58);
    if (bVar1) {
      pvVar5 = std::vector<wasm::TypeNames,_std::allocator<wasm::TypeNames>_>::operator[]
                         (&this->names,(ulong)this->index);
      this_00 = std::
                unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                ::operator[](&pvVar5->fieldNames,
                             (key_type *)((long)&name.super_IString.str._M_str + 4));
      wasm::Name::operator=(this_00,(Name *)local_58);
    }
  }
  return;
}

Assistant:

void addStructType(StructT& type) {
    auto& [fieldNames, str] = type;
    builder[index] = str;
    for (Index i = 0; i < fieldNames.size(); ++i) {
      if (auto name = fieldNames[i]; name.is()) {
        names[index].fieldNames[i] = name;
      }
    }
  }